

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::CBString(CBString *this,char c,int len)

{
  uchar *puVar1;
  CBStringException *this_00;
  size_t __n;
  CBStringException bstr__cppwrapper_exception;
  string local_60;
  CBStringException local_40;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00184840;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < len) {
    (this->super_tagbstring).mlen = len + 1U;
    (this->super_tagbstring).slen = len;
    puVar1 = (uchar *)malloc((ulong)(len + 1U));
    (this->super_tagbstring).data = puVar1;
  }
  puVar1 = (this->super_tagbstring).data;
  if (puVar1 != (uchar *)0x0) {
    __n = (size_t)(this->super_tagbstring).slen;
    if (0 < (long)__n) {
      memset(puVar1,(uint)(byte)c,__n);
    }
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    return;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"CBString::Failure in repeat(char) constructor","");
  CBStringException::CBStringException(&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_40);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (char c, int len) {
	data = NULL;
	if (len >= 0) {
		mlen = len + 1;
		slen = len;
		data = (unsigned char *) bstr__alloc (mlen);
	}
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in repeat(char) constructor");
	} else {
		if (slen > 0) bstr__memset (data, c, slen);
		data[slen] = '\0';
	}
}